

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void print_ex(vw *all,size_t ex_processed,size_t vals_found,size_t progress)

{
  _func_int *p_Var1;
  ostream *poVar2;
  
  p_Var1 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
  *(uint *)(p_Var1 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) =
       *(uint *)(p_Var1 + 0x18 + (long)&(all->trace_message).super_ostream._vptr_basic_ostream) &
       0xffffff4f | 0x20;
  *(undefined8 *)
   ((all->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
   (long)&(all->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
  poVar2 = std::operator<<(poVar2," ");
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 9;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 0xc;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'%');
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

inline void print_ex(vw& all, size_t ex_processed, size_t vals_found, size_t progress)
{
  all.trace_message << std::left << std::setw(shared_data::col_example_counter) << ex_processed << " " << std::right
                    << std::setw(9) << vals_found << " " << std::right << std::setw(12) << progress << '%' << std::endl;
}